

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrBasic.c
# Opt level: O3

void Mtr_PrintTree(MtrNode *node)

{
  if (node != (MtrNode *)0x0) {
    do {
      fprintf(_stdout,"N=0x%-8lx C=0x%-8lx Y=0x%-8lx E=0x%-8lx P=0x%-8lx F=%x L=%u S=%u\n",node,
              node->child,node->younger,node->elder,node->parent,(ulong)node->flags,(ulong)node->low
              ,(ulong)node->size);
      if ((node->flags & 1) == 0) {
        Mtr_PrintTree(node->child);
      }
      node = node->younger;
    } while (node != (MtrNode *)0x0);
  }
  return;
}

Assistant:

void
Mtr_PrintTree(
  MtrNode * node)
{
    if (node == NULL) return;
    (void) fprintf(stdout,
#if SIZEOF_VOID_P == 8
    "N=0x%-8lx C=0x%-8lx Y=0x%-8lx E=0x%-8lx P=0x%-8lx F=%x L=%u S=%u\n",
    (unsigned long) node, (unsigned long) node->child,
    (unsigned long) node->younger, (unsigned long) node->elder,
    (unsigned long) node->parent, node->flags, node->low, node->size);
#else
    "N=0x%-8x C=0x%-8x Y=0x%-8x E=0x%-8x P=0x%-8x F=%x L=%hu S=%hu\n",
    (unsigned) node, (unsigned) node->child,
    (unsigned) node->younger, (unsigned) node->elder,
    (unsigned) node->parent, node->flags, node->low, node->size);
#endif
    if (!MTR_TEST(node,MTR_TERMINAL)) Mtr_PrintTree(node->child);
    Mtr_PrintTree(node->younger);
    return;

}